

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

int Amap_ManMergeCountCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iFan0;
  int iFan1;
  uint uVar4;
  Amap_Obj_t *pAVar5;
  Amap_Obj_t *pAVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint *local_68;
  
  pAVar5 = Amap_ObjFanin0(p,pNode);
  pAVar6 = Amap_ObjFanin1(p,pNode);
  local_68 = (uint *)(pAVar5->field_11).pData;
  iVar7 = 1;
  for (uVar9 = 0; uVar9 < *(uint *)&pAVar5->field_0x8 >> 0xc; uVar9 = uVar9 + 1) {
    puVar10 = (uint *)(pAVar6->field_11).pData;
    for (uVar8 = 0; uVar8 < *(uint *)&pAVar6->field_0x8 >> 0xc; uVar8 = uVar8 + 1) {
      uVar4 = *local_68;
      uVar2 = Amap_ObjFaninC0(pNode);
      uVar1 = *puVar10;
      uVar3 = Amap_ObjFaninC1(pNode);
      iFan1 = 0;
      iFan0 = 0;
      if ((ushort)*local_68 != 0) {
        iFan0 = Abc_Var2Lit((uint)(ushort)*local_68,uVar4 >> 0x10 & 1 ^ uVar2);
      }
      if ((ushort)*puVar10 != 0) {
        iFan1 = Abc_Var2Lit((uint)(ushort)*puVar10,uVar1 >> 0x10 & 1 ^ uVar3);
      }
      uVar4 = Amap_LibFindNode(p->pLib,iFan0,iFan1,
                               (uint)(((undefined1  [88])*pNode & (undefined1  [88])0x7) ==
                                     (undefined1  [88])0x5));
      iVar7 = iVar7 - ((int)~uVar4 >> 0x1f);
      puVar10 = puVar10 + (ulong)(*puVar10 >> 0x11) + 1;
    }
    local_68 = local_68 + (ulong)(*local_68 >> 0x11) + 1;
  }
  return iVar7;
}

Assistant:

int Amap_ManMergeCountCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int Entry, c0, c1, iCompl0, iCompl1, iFan0, iFan1;
    int Counter = 1;
    Amap_NodeForEachCut( pFanin0, pCut0, c0 )
    Amap_NodeForEachCut( pFanin1, pCut1, c1 )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
        Entry = Amap_LibFindNode( p->pLib, iFan0, iFan1, pNode->Type == AMAP_OBJ_XOR );
        Counter += ( Entry >=0 );
//        if ( Entry >=0 )
//            printf( "Full: %d + %d = %d\n", iFan0, iFan1, Entry );
    }
    return Counter;
}